

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_string_concat(sysbvm_context_t *context,sysbvm_tuple_t left,sysbvm_tuple_t right)

{
  size_t __n;
  size_t __n_00;
  _Bool *__dest;
  uint8_t *resultData;
  sysbvm_tuple_t result;
  size_t resultSize;
  size_t rightSize;
  size_t leftSize;
  sysbvm_tuple_t right_local;
  sysbvm_tuple_t left_local;
  sysbvm_context_t *context_local;
  
  __n = sysbvm_tuple_getSizeInBytes(left);
  __n_00 = sysbvm_tuple_getSizeInBytes(right);
  context_local = (sysbvm_context_t *)right;
  if ((__n != 0) && (context_local = (sysbvm_context_t *)left, __n_00 != 0)) {
    context_local = (sysbvm_context_t *)sysbvm_string_createEmptyWithSize(context,__n + __n_00);
    __dest = &(context_local->heap).shouldAttemptToCollect;
    memcpy(__dest,(void *)(left + 0x10),__n);
    memcpy(__dest + __n,(void *)(right + 0x10),__n_00);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_string_concat(sysbvm_context_t *context, sysbvm_tuple_t left, sysbvm_tuple_t right)
{
    size_t leftSize = sysbvm_tuple_getSizeInBytes(left);
    size_t rightSize = sysbvm_tuple_getSizeInBytes(right);

    if(leftSize == 0)
        return right;
    if(rightSize == 0)
        return left;

    size_t resultSize = leftSize + rightSize;
    sysbvm_tuple_t result = sysbvm_string_createEmptyWithSize(context, resultSize);
    uint8_t *resultData = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(result)->bytes;
    memcpy(resultData, SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(left)->bytes, leftSize);
    memcpy(resultData + leftSize, SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(right)->bytes, rightSize);
    return result;
}